

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureGatherTests.cpp
# Opt level: O2

vector<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
* vkt::sr::anon_unknown_0::generateCubeCaseIterations
            (vector<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
             *__return_storage_ptr__,GatherType gatherType,TextureFormat *textureFormat,
            IVec2 *offsetRange)

{
  int *piVar1;
  undefined8 *puVar2;
  pointer pGVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  undefined8 uVar8;
  ulong uVar9;
  ulong uVar10;
  CubeFace CVar11;
  ulong uVar12;
  long lVar13;
  value_type local_78;
  vector<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
  basicIterations;
  
  generateBasic2DCaseIterations(&basicIterations,gatherType,textureFormat,offsetRange);
  (__return_storage_ptr__->
  super__Vector_base<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar9 = ((long)basicIterations.
                 super__Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)basicIterations.
                super__Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
                ._M_impl.super__Vector_impl_data._M_start) / 0x24;
  uVar12 = 0;
  uVar10 = uVar9 & 0xffffffff;
  if ((int)uVar9 < 1) {
    uVar10 = uVar12;
  }
  do {
    CVar11 = (CubeFace)uVar12;
    if (CVar11 == CUBEFACE_NEGATIVE_X) {
      for (lVar13 = 0; uVar10 * 0x24 - lVar13 != 0; lVar13 = lVar13 + 0x24) {
        local_78.gatherArgs.offsets[1].m_data[1] = 0;
        local_78.gatherArgs.offsets[2].m_data[0] = 0;
        local_78.gatherArgs.offsets[2].m_data[1] = 0;
        local_78.gatherArgs.offsets[3].m_data[0] = 0;
        local_78.gatherArgs.componentNdx = 0;
        local_78.gatherArgs.offsets[0].m_data[0] = 0;
        local_78.gatherArgs.offsets[0].m_data[1] = 0;
        local_78.gatherArgs.offsets[1].m_data[0] = 0;
        local_78.gatherArgs.offsets[3].m_data[1] = 0;
        local_78.face = CUBEFACE_NEGATIVE_X;
        GatherArgs::GatherArgs(&local_78.gatherArgs);
        std::
        vector<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
        ::push_back(__return_storage_ptr__,&local_78);
        pGVar3 = (__return_storage_ptr__->
                 super__Vector_base<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        pGVar3[-1].gatherArgs.offsets[3].m_data[1] =
             *(int *)((long)(basicIterations.
                             super__Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
                             ._M_impl.super__Vector_impl_data._M_start)->offsets[3].m_data +
                     lVar13 + 4);
        piVar1 = (int *)((long)(basicIterations.
                                super__Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
                                ._M_impl.super__Vector_impl_data._M_start)->offsets[0].m_data +
                        lVar13 + -4);
        iVar4 = *piVar1;
        iVar5 = piVar1[1];
        iVar6 = piVar1[2];
        iVar7 = piVar1[3];
        puVar2 = (undefined8 *)
                 ((long)(basicIterations.
                         super__Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
                         ._M_impl.super__Vector_impl_data._M_start)->offsets[1].m_data + lVar13 + 4)
        ;
        uVar8 = puVar2[1];
        *(undefined8 *)(pGVar3[-1].gatherArgs.offsets[1].m_data + 1) = *puVar2;
        *(undefined8 *)(pGVar3[-1].gatherArgs.offsets[2].m_data + 1) = uVar8;
        pGVar3[-1].gatherArgs.componentNdx = iVar4;
        pGVar3[-1].gatherArgs.offsets[0].m_data[0] = iVar5;
        pGVar3[-1].gatherArgs.offsets[0].m_data[1] = iVar6;
        pGVar3[-1].gatherArgs.offsets[1].m_data[0] = iVar7;
        pGVar3[-1].face = CUBEFACE_NEGATIVE_X;
      }
    }
    else {
      if (CVar11 == CUBEFACE_LAST) {
        std::
        _Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
        ::~_Vector_base(&basicIterations.
                         super__Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
                       );
        return __return_storage_ptr__;
      }
      for (lVar13 = 0; uVar10 * 0x24 - lVar13 != 0; lVar13 = lVar13 + 0x24) {
        if (((textureFormat->order == D) || (textureFormat->order == DS)) ||
           (*(CubeFace *)
             ((long)(basicIterations.
                     super__Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
                     ._M_impl.super__Vector_impl_data._M_start)->offsets[0].m_data + lVar13 + -4) ==
            (CVar11 & CUBEFACE_POSITIVE_Y))) {
          local_78.gatherArgs.offsets[1].m_data[1] = 0;
          local_78.gatherArgs.offsets[2].m_data[0] = 0;
          local_78.gatherArgs.offsets[2].m_data[1] = 0;
          local_78.gatherArgs.offsets[3].m_data[0] = 0;
          local_78.gatherArgs.componentNdx = 0;
          local_78.gatherArgs.offsets[0].m_data[0] = 0;
          local_78.gatherArgs.offsets[0].m_data[1] = 0;
          local_78.gatherArgs.offsets[1].m_data[0] = 0;
          local_78.gatherArgs.offsets[3].m_data[1] = 0;
          local_78.face = CUBEFACE_NEGATIVE_X;
          GatherArgs::GatherArgs(&local_78.gatherArgs);
          std::
          vector<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
          ::push_back(__return_storage_ptr__,&local_78);
          pGVar3 = (__return_storage_ptr__->
                   super__Vector_base<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          pGVar3[-1].gatherArgs.offsets[3].m_data[1] =
               *(int *)((long)(basicIterations.
                               super__Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
                               ._M_impl.super__Vector_impl_data._M_start)->offsets[3].m_data +
                       lVar13 + 4);
          piVar1 = (int *)((long)(basicIterations.
                                  super__Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->offsets[0].m_data +
                          lVar13 + -4);
          iVar4 = *piVar1;
          iVar5 = piVar1[1];
          iVar6 = piVar1[2];
          iVar7 = piVar1[3];
          puVar2 = (undefined8 *)
                   ((long)(basicIterations.
                           super__Vector_base<vkt::sr::(anonymous_namespace)::GatherArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherArgs>_>
                           ._M_impl.super__Vector_impl_data._M_start)->offsets[1].m_data +
                   lVar13 + 4);
          uVar8 = puVar2[1];
          *(undefined8 *)(pGVar3[-1].gatherArgs.offsets[1].m_data + 1) = *puVar2;
          *(undefined8 *)(pGVar3[-1].gatherArgs.offsets[2].m_data + 1) = uVar8;
          pGVar3[-1].gatherArgs.componentNdx = iVar4;
          pGVar3[-1].gatherArgs.offsets[0].m_data[0] = iVar5;
          pGVar3[-1].gatherArgs.offsets[0].m_data[1] = iVar6;
          pGVar3[-1].gatherArgs.offsets[1].m_data[0] = iVar7;
          pGVar3[-1].face = CVar11;
          break;
        }
      }
    }
    uVar12 = (ulong)(CVar11 + CUBEFACE_POSITIVE_X);
  } while( true );
}

Assistant:

vector<GatherCubeArgs> generateCubeCaseIterations (GatherType gatherType, const tcu::TextureFormat& textureFormat, const IVec2& offsetRange)
{
	const vector<GatherArgs>	basicIterations = generateBasic2DCaseIterations(gatherType, textureFormat, offsetRange);
	vector<GatherCubeArgs>		iterations;

	for (int cubeFaceI = 0; cubeFaceI < tcu::CUBEFACE_LAST; cubeFaceI++)
	{
		const tcu::CubeFace cubeFace = (tcu::CubeFace)cubeFaceI;

		// Don't duplicate all cases for all faces.
		if (cubeFaceI == 0)
		{
			for (int basicNdx = 0; basicNdx < (int)basicIterations.size(); basicNdx++)
			{
				iterations.push_back(GatherCubeArgs());
				iterations.back().gatherArgs = basicIterations[basicNdx];
				iterations.back().face = cubeFace;
			}
		}
		else
		{
			// For other faces than first, only test one component per face.
			for (int basicNdx = 0; basicNdx < (int)basicIterations.size(); basicNdx++)
			{
				if (isDepthFormat(textureFormat) || basicIterations[basicNdx].componentNdx == cubeFaceI % 4)
				{
					iterations.push_back(GatherCubeArgs());
					iterations.back().gatherArgs = basicIterations[basicNdx];
					iterations.back().face = cubeFace;
					break;
				}
			}
		}
	}

	return iterations;
}